

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O3

Ptr __thiscall Bind::ChoosePolymer(Bind *this)

{
  pointer psVar1;
  element_type *peVar2;
  VecPtr *pVVar3;
  mapped_type_conflict *pmVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<Polymer> *polymer_1;
  pointer psVar6;
  long in_RSI;
  key_type *promoter_name;
  shared_ptr<Polymer> sVar7;
  Ptr PVar8;
  Ptr *polymer;
  vector<double,_std::allocator<double>_> local_68;
  SpeciesTracker *local_48;
  element_type *local_40;
  double local_38;
  
  local_40 = (element_type *)this;
  local_48 = SpeciesTracker::Instance();
  promoter_name = (key_type *)(in_RSI + 0x38);
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  pVVar3 = SpeciesTracker::FindPolymers(local_48,promoter_name);
  psVar6 = (pVVar3->
           super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (pVVar3->
           super__Vector_base<std::shared_ptr<Polymer>,_std::allocator<std::shared_ptr<Polymer>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar6 != psVar1) {
    do {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&((psVar6->super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->uncovered_,promoter_name);
      local_38 = (double)*pmVar4;
      if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_38);
      }
      else {
        *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_38;
        local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar1);
  }
  pVVar3 = SpeciesTracker::FindPolymers(local_48,promoter_name);
  peVar2 = local_40;
  sVar7 = Random::WeightedChoice<std::shared_ptr<Polymer>>((Random *)local_40,pVVar3,&local_68);
  _Var5 = sVar7.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
    _Var5._M_pi = extraout_RDX;
  }
  PVar8.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  PVar8.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  return (Ptr)PVar8.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Polymer::Ptr Bind::ChoosePolymer() {
  auto &tracker = SpeciesTracker::Instance();
  auto weights = std::vector<double>();
  for (const auto &polymer : tracker.FindPolymers(promoter_name_)) {
    weights.push_back(double(polymer->uncovered(promoter_name_)));
  }
  Polymer::Ptr polymer =
      Random::WeightedChoice(tracker.FindPolymers(promoter_name_), weights);
  return polymer;
}